

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void mob_death_log(CHAR_DATA *killer,CHAR_DATA *dead)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  long in_RSI;
  long in_RDI;
  FILE *fp;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  ROOM_INDEX_DATA *in_stack_ffffffffffffffc8;
  undefined8 uVar6;
  
  bVar3 = is_npc(in_stack_ffffffffffffffb8);
  if ((((bVar3) && (bVar3 = is_npc(in_stack_ffffffffffffffb8), !bVar3)) &&
      (bVar3 = is_explore(in_stack_ffffffffffffffc8), bVar3)) &&
     (__stream = fopen("../logs/mobdeaths.txt","a"), __stream != (FILE *)0x0)) {
    uVar6 = *(undefined8 *)(in_RSI + 0xf0);
    uVar1 = *(undefined8 *)(in_RDI + 0x108);
    uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0xa8) + 0x30) + 0x40);
    pcVar4 = get_room_name((ROOM_INDEX_DATA *)in_stack_ffffffffffffffb8);
    pcVar5 = ctime(&current_time);
    fprintf(__stream,"%s | %s | %s | %s | %s",uVar6,uVar1,uVar2,pcVar4,pcVar5);
    fclose(__stream);
  }
  return;
}

Assistant:

void mob_death_log(CHAR_DATA *killer, CHAR_DATA *dead)
{
	if (!is_npc(killer) || is_npc(dead) || !is_explore(killer->in_room))
		return;

	auto fp = fopen(MOB_LOG_FILE, "a");
	if (fp == nullptr)
		return;

	fprintf(fp, "%s | %s | %s | %s | %s",
			dead->true_name,
			killer->short_descr,
			killer->in_room->area->name,
			get_room_name(killer->in_room),
			ctime(&current_time));

	fclose(fp);
}